

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceVertexVectorQuantity::buildVertexInfoGUI
          (SurfaceVertexVectorQuantity *this,size_t iV)

{
  char *in_RDI;
  float fVar1;
  undefined1 extraout_var [56];
  undefined1 auVar2 [64];
  vec<3,_float,_(glm::qualifier)0> vVar4;
  stringstream buffer;
  size_t in_stack_00000058;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *in_stack_00000060;
  vec3 vec;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  vec3 *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  stringstream local_1b8 [136];
  undefined1 auVar3 [56];
  
  std::__cxx11::string::c_str();
  auVar3 = extraout_var;
  ImGui::TextUnformatted
            (in_RDI,(char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  ImGui::NextColumn();
  vVar4 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getValue
                    (in_stack_00000060,in_stack_00000058);
  auVar2._0_8_ = vVar4._0_8_;
  auVar2._8_56_ = auVar3;
  vmovlpd_avx(auVar2._0_16_);
  std::__cxx11::stringstream::stringstream(local_1b8);
  polyscope::operator<<(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  ImGui::TextUnformatted
            (in_RDI,(char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  ImGui::NextColumn();
  ImGui::NextColumn();
  fVar1 = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)0x48ea36);
  ImGui::Text((char *)(double)fVar1,"magnitude: %g");
  ImGui::NextColumn();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void SurfaceVertexVectorQuantity::buildVertexInfoGUI(size_t iV) {
  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();

  glm::vec3 vec = vectors.getValue(iV);

  std::stringstream buffer;
  buffer << vec;
  ImGui::TextUnformatted(buffer.str().c_str());

  ImGui::NextColumn();
  ImGui::NextColumn();
  ImGui::Text("magnitude: %g", glm::length(vec));
  ImGui::NextColumn();
}